

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

int Nf_StoCellIsDominated(Mio_Cell2_t *pCell,int *pFans,int *pProf)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((float)*pProf < pCell->AreaF || (float)*pProf == pCell->AreaF) {
    uVar3 = 0;
    do {
      if (*(uint *)&pCell->field_0x10 >> 0x1c <= uVar3) {
        return 1;
      }
      uVar2 = Abc_Lit2Var(pFans[uVar3]);
      lVar1 = uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (pProf[lVar1] <= pCell->iDelays[uVar2]);
  }
  return 0;
}

Assistant:

int Nf_StoCellIsDominated( Mio_Cell2_t * pCell, int * pFans, int * pProf )
{
    int k;
    if ( pCell->AreaF < Abc_Int2Float(pProf[0]) )
        return 0;
    for ( k = 0; k < (int)pCell->nFanins; k++ )
        if ( pCell->iDelays[Abc_Lit2Var(pFans[k])] < pProf[k+1] )
            return 0;
    return 1; // pCell is dominated
}